

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O2

void __thiscall
groundupdbext::FileKeyValueStore::setKeyValue(FileKeyValueStore *this,HashedValue *key,Set *value)

{
  HashedValue *pHVar1;
  size_type sVar2;
  size_t __val;
  ostream *poVar3;
  byte *b;
  _Alloc_hider _Var4;
  __node_base *p_Var5;
  byte *b_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  HashedValue *local_2c0;
  FileKeyValueStore *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string keyHash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string fp;
  ofstream os;
  
  std::ofstream::ofstream(&os);
  __val = groundupdb::HashedValue::hash(key);
  std::__cxx11::to_string(&keyHash,__val);
  std::operator+(&local_2b0,
                 &((this->mImpl)._M_t.
                   super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                   .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>.
                  _M_head_impl)->m_fullpath,"/");
  std::operator+(&local_2e0,&local_2b0,&keyHash);
  std::operator+(&fp,&local_2e0,".kv");
  local_2b8 = this;
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::ofstream::open((string *)&os,(_Ios_Openmode)&fp);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&os);
  std::endl<char,std::char_traits<char>>(poVar3);
  p_Var5 = &(((value->_M_t).
              super___uniq_ptr_impl<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
              .
              super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
             ._M_head_impl)->_M_h)._M_before_begin;
  local_2c0 = key;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    poVar3 = std::ostream::_M_insert<bool>(SUB81((ostream *)&os,0));
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = groundupdb::operator<<((ostream *)&os,*(Type *)((long)(p_Var5 + 1) + 4));
    std::endl<char,std::char_traits<char>>(poVar3);
    pHVar1 = (HashedValue *)(p_Var5 + 2);
    groundupdb::HashedValue::length(pHVar1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&os);
    std::endl<char,std::char_traits<char>>(poVar3);
    groundupdb::HashedValue::data((Bytes *)&local_2e0,pHVar1);
    sVar2 = local_2e0._M_string_length;
    for (_Var4._M_p = local_2e0._M_dataplus._M_p; _Var4._M_p != (pointer)sVar2;
        _Var4._M_p = _Var4._M_p + 1) {
      std::operator<<((ostream *)&os,*_Var4._M_p);
    }
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&local_2e0);
    std::endl<char,std::char_traits<char>>((ostream *)&os);
    groundupdb::HashedValue::hash(pHVar1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&os);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ofstream::close();
  pHVar1 = local_2c0;
  std::operator+(&local_270,
                 &((local_2b8->mImpl)._M_t.
                   super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                   .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>.
                  _M_head_impl)->m_fullpath,"/");
  std::operator+(&local_2b0,&local_270,&keyHash);
  std::operator+(&local_2e0,&local_2b0,".key");
  std::ofstream::open((string *)&os,(_Ios_Openmode)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  poVar3 = std::operator<<((ostream *)&os,"set");
  std::endl<char,std::char_traits<char>>(poVar3);
  groundupdb::HashedValue::data((Bytes *)&local_2e0,pHVar1);
  for (_Var4._M_p = local_2e0._M_dataplus._M_p; _Var4._M_p != (pointer)local_2e0._M_string_length;
      _Var4._M_p = _Var4._M_p + 1) {
    std::operator<<((ostream *)&os,*_Var4._M_p);
  }
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&local_2e0);
  std::endl<char,std::char_traits<char>>((ostream *)&os);
  std::ofstream::close();
  std::__cxx11::string::~string((string *)&fp);
  std::__cxx11::string::~string((string *)&keyHash);
  std::ofstream::~ofstream(&os);
  return;
}

Assistant:

void
FileKeyValueStore::setKeyValue(const HashedValue& key,const Set& value) {
  // store in _string_set.kl file elements_num<length,value...>...
  std::ofstream os;
  std::string keyHash(std::to_string(key.hash()));
  std::string fp(mImpl->m_fullpath + "/" + keyHash + ".kv");
  os.open(fp,
          std::ios::out | std::ios::trunc);
  os << value->size() << std::endl;
  for (auto val = value->begin();val != value->end(); val++) {
    //std::cout << "  Writing set value with length: " << val->length() << ", hash: " << val->hash() << std::endl;
    os << val->hasValue() << std::endl;
    os << val->type() << std::endl;
    os << val->length() << std::endl;
    for (auto& b : val->data()) {
      os << (const char)b;
    }
    os << std::endl;
    os << val->hash() << std::endl;
  }
  os.close();
  // TODO allow multiple keys for this hash (read, modify, write)
  os.open(mImpl->m_fullpath + "/" + keyHash + ".key",
          std::ios::out | std::ios::trunc);
  os << "set" << std::endl;
  for (auto& b : key.data()) {
    os << (const char)b;
  }
  os << std::endl;
  os.close();
}